

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSyncTests.cpp
# Opt level: O0

int __thiscall deqp::egl::anon_unknown_0::SyncTest::init(SyncTest *this,EVP_PKEY_CTX *ctx)

{
  EglTestContext *this_00;
  deUint32 dVar1;
  deBool dVar2;
  int iVar3;
  Visibility visibility_;
  Library *egl_00;
  NativeDisplayFactory *factory;
  CommandLine *pCVar4;
  NativeWindowFactory *pNVar5;
  NativeDisplay *pNVar6;
  EGLDisplay pvVar7;
  EGLConfig pvVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  EGLSurface pvVar9;
  SyncTest *extraout_RAX;
  WindowParams local_68;
  Extension local_5c;
  deUint32 local_58;
  Extension syncTypeExtension;
  EGLint contextAttribList [3];
  EGLint displayAttribList [7];
  NativeWindowFactory *windowFactory;
  Library *egl;
  SyncTest *this_local;
  
  egl_00 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  factory = EglTestContext::getNativeDisplayFactory((this->super_TestCase).m_eglTestCtx);
  pCVar4 = tcu::TestContext::getCommandLine
                     ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pNVar5 = eglu::selectNativeWindowFactory(factory,pCVar4);
  contextAttribList[1] = 0x3040;
  contextAttribList[2] = 4;
  _syncTypeExtension = 0x200003098;
  contextAttribList[0] = 0x3038;
  pNVar6 = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
  pvVar7 = eglu::getAndInitDisplay(pNVar6,(Version *)0x0);
  this->m_eglDisplay = pvVar7;
  pvVar8 = eglu::chooseSingleConfig(egl_00,this->m_eglDisplay,contextAttribList + 1);
  this->m_eglConfig = pvVar8;
  this_00 = (this->super_TestCase).m_eglTestCtx;
  local_58 = (deUint32)glu::ApiType::es(2,0);
  EglTestContext::initGLFunctions(this_00,&this->m_gl,(ApiType)local_58);
  local_5c = getSyncTypeExtension(this->m_syncType);
  requiredEGLExtensions(egl_00,this->m_eglDisplay,this->m_extensions | local_5c);
  if ((this->m_useCurrentContext & 1U) != 0) {
    do {
      (**egl_00->_vptr_Library)(egl_00,0x30a0);
      dVar1 = (*egl_00->_vptr_Library[0x1f])();
      eglu::checkError(dVar1,"bindAPI(EGL_OPENGL_ES_API)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                       ,0xd9);
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    iVar3 = (*egl_00->_vptr_Library[6])
                      (egl_00,this->m_eglDisplay,this->m_eglConfig,0,&syncTypeExtension);
    this->m_eglContext = (EGLContext)CONCAT44(extraout_var,iVar3);
    dVar1 = (*egl_00->_vptr_Library[0x1f])();
    eglu::checkError(dVar1,"Failed to create GLES2 context",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                     ,0xdb);
    pNVar6 = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
    pvVar7 = this->m_eglDisplay;
    pvVar8 = this->m_eglConfig;
    pCVar4 = tcu::TestContext::getCommandLine
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    visibility_ = eglu::parseWindowVisibility(pCVar4);
    eglu::WindowParams::WindowParams(&local_68,0x1e0,0x1e0,visibility_);
    iVar3 = (*(pNVar5->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                      (pNVar5,pNVar6,pvVar7,pvVar8,0,&local_68);
    this->m_nativeWindow = (NativeWindow *)CONCAT44(extraout_var_00,iVar3);
    pNVar6 = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
    pvVar9 = eglu::createWindowSurface
                       (pNVar6,this->m_nativeWindow,this->m_eglDisplay,this->m_eglConfig,
                        (EGLAttrib *)0x0);
    this->m_eglSurface = pvVar9;
    do {
      (*egl_00->_vptr_Library[0x27])
                (egl_00,this->m_eglDisplay,this->m_eglSurface,this->m_eglSurface,this->m_eglContext)
      ;
      dVar1 = (*egl_00->_vptr_Library[0x1f])();
      eglu::checkError(dVar1,"makeCurrent(m_eglDisplay, m_eglSurface, m_eglSurface, m_eglContext)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                       ,0xe1);
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    requiredGLESExtensions(&this->m_gl);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

void SyncTest::init (void)
{
	const Library&						egl				= m_eglTestCtx.getLibrary();
	const eglu::NativeWindowFactory&	windowFactory	= eglu::selectNativeWindowFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

	const EGLint displayAttribList[] =
	{
		EGL_RENDERABLE_TYPE,	EGL_OPENGL_ES2_BIT,
		EGL_SURFACE_TYPE,		EGL_WINDOW_BIT,
		EGL_ALPHA_SIZE,			1,
		EGL_NONE
	};

	const EGLint contextAttribList[] =
	{
		EGL_CONTEXT_CLIENT_VERSION, 2,
		EGL_NONE
	};

	m_eglDisplay	= eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
	m_eglConfig		= eglu::chooseSingleConfig(egl, m_eglDisplay, displayAttribList);

	m_eglTestCtx.initGLFunctions(&m_gl, glu::ApiType::es(2,0));

	{
		const Extension syncTypeExtension = getSyncTypeExtension(m_syncType);
		requiredEGLExtensions(egl, m_eglDisplay, (Extension)(m_extensions | syncTypeExtension));
	}

	if (m_useCurrentContext)
	{
		// Create context
		EGLU_CHECK_CALL(egl, bindAPI(EGL_OPENGL_ES_API));
		m_eglContext = egl.createContext(m_eglDisplay, m_eglConfig, EGL_NO_CONTEXT, contextAttribList);
		EGLU_CHECK_MSG(egl, "Failed to create GLES2 context");

		// Create surface
		m_nativeWindow = windowFactory.createWindow(&m_eglTestCtx.getNativeDisplay(), m_eglDisplay, m_eglConfig, DE_NULL, eglu::WindowParams(480, 480, eglu::parseWindowVisibility(m_testCtx.getCommandLine())));
		m_eglSurface = eglu::createWindowSurface(m_eglTestCtx.getNativeDisplay(), *m_nativeWindow, m_eglDisplay, m_eglConfig, DE_NULL);

		EGLU_CHECK_CALL(egl, makeCurrent(m_eglDisplay, m_eglSurface, m_eglSurface, m_eglContext));

		requiredGLESExtensions(m_gl);
	}
}